

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode writeNamespaces(void *handle,UA_NodeId nodeid,UA_Variant *data,UA_NumericRange *range)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  UA_StatusCode UVar7;
  ulong uVar8;
  long lVar9;
  UA_String name;
  
  UVar7 = 0x80740000;
  if ((data->type == (UA_DataType *)0x13f5c0) && (pvVar1 = data->data, pvVar1 != (void *)0x0)) {
    if (range == (UA_NumericRange *)0x0) {
      uVar2 = data->arrayLength;
      uVar3 = *(ulong *)((long)handle + 0x58);
      if (uVar3 < uVar2) {
        if (uVar3 != 0) {
          lVar9 = *(long *)((long)handle + 0x60);
          lVar6 = 8;
          uVar8 = uVar3;
          do {
            __n = *(size_t *)(lVar9 + -8 + lVar6);
            if (__n != *(size_t *)((long)pvVar1 + lVar6 + -8)) goto LAB_0011a472;
            iVar4 = bcmp(*(void **)(lVar9 + lVar6),*(void **)((long)pvVar1 + lVar6),__n);
            if (iVar4 != 0) goto LAB_0011a472;
            lVar6 = lVar6 + 0x10;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        lVar9 = uVar2 - uVar3;
        UVar7 = 0;
        if (uVar3 <= uVar2 && lVar9 != 0) {
          puVar5 = (undefined8 *)((long)pvVar1 + uVar3 * 0x10 + 8);
          do {
            name.data = (UA_Byte *)*puVar5;
            name.length = puVar5[-1];
            addNamespace((UA_Server *)handle,name);
            puVar5 = puVar5 + 2;
            lVar9 = lVar9 + -1;
            UVar7 = 0;
          } while (lVar9 != 0);
        }
      }
    }
    else {
LAB_0011a472:
      UVar7 = 0x80020000;
    }
  }
  return UVar7;
}

Assistant:

static UA_StatusCode
writeNamespaces(void *handle, const UA_NodeId nodeid, const UA_Variant *data,
                const UA_NumericRange *range) {
    UA_Server *server = (UA_Server*)handle;

    /* Check the data type */
    if(data->type != &UA_TYPES[UA_TYPES_STRING])
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Check that the variant is not empty */
    if(!data->data)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* TODO: Writing with a range is not implemented */
    if(range)
        return UA_STATUSCODE_BADINTERNALERROR;

    UA_String *newNamespaces = data->data;
    size_t newNamespacesSize = data->arrayLength;

    /* Test if we append to the existing namespaces */
    if(newNamespacesSize <= server->namespacesSize)
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Test if the existing namespaces are unchanged */
    for(size_t i = 0; i < server->namespacesSize; ++i) {
        if(!UA_String_equal(&server->namespaces[i], &newNamespaces[i]))
            return UA_STATUSCODE_BADINTERNALERROR;
    }

    /* Add namespaces */
    for(size_t i = server->namespacesSize; i < newNamespacesSize; ++i)
        addNamespace(server, newNamespaces[i]);
    return UA_STATUSCODE_GOOD;
}